

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

utf_error utf8::internal::validate_next<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *it,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         end,uint32_t *code_point)

{
  byte bVar1;
  utf_error uVar2;
  int iVar3;
  byte *pbVar4;
  uint32_t local_1c;
  
  pbVar4 = (byte *)it->_M_current;
  local_1c = 0;
  bVar1 = *pbVar4;
  if ((char)bVar1 < '\0') {
    if ((bVar1 & 0xffffffe0) == 0xc0) {
      uVar2 = NOT_ENOUGH_ROOM;
      if ((pbVar4 != (byte *)end._M_current) &&
         (it->_M_current = (char *)(pbVar4 + 1), pbVar4 + 1 != (byte *)end._M_current)) {
        uVar2 = INCOMPLETE_SEQUENCE;
      }
      goto LAB_0063a4a4;
    }
    if ((bVar1 & 0xf0) == 0xe0) {
      uVar2 = get_sequence_3<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                        (it,end,&local_1c);
      iVar3 = 3;
    }
    else {
      if ((bVar1 & 0xf8) != 0xf0) {
        return INVALID_LEAD;
      }
      uVar2 = get_sequence_4<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                        (it,end,&local_1c);
      iVar3 = 4;
    }
    if (uVar2 != UTF8_OK) goto LAB_0063a4a4;
  }
  else {
    iVar3 = 1;
    local_1c = (uint)bVar1;
    if (pbVar4 == (byte *)end._M_current) {
      uVar2 = NOT_ENOUGH_ROOM;
      goto LAB_0063a4a4;
    }
  }
  uVar2 = INVALID_CODE_POINT;
  if ((local_1c & 0xfffff800) != 0xd800 && local_1c < 0x110000) {
    if (local_1c < 0x80) {
      uVar2 = OVERLONG_SEQUENCE;
      if (iVar3 != 1) goto LAB_0063a4a4;
    }
    else if (local_1c < 0x800) {
      uVar2 = OVERLONG_SEQUENCE;
      if (iVar3 != 2) goto LAB_0063a4a4;
    }
    else {
      uVar2 = OVERLONG_SEQUENCE;
      if (local_1c < 0x10000 && iVar3 != 3) goto LAB_0063a4a4;
    }
    *code_point = local_1c;
    pbVar4 = (byte *)(it->_M_current + 1);
    uVar2 = UTF8_OK;
  }
LAB_0063a4a4:
  it->_M_current = (char *)pbVar4;
  return uVar2;
}

Assistant:

utf_error validate_next(octet_iterator& it, octet_iterator end, uint32_t& code_point)
    {
        // Save the original value of it so we can go back in case of failure
        // Of course, it does not make much sense with i.e. stream iterators
        octet_iterator original_it = it;

        uint32_t cp = 0;
        // Determine the sequence length based on the lead octet
        typedef typename std::iterator_traits<octet_iterator>::difference_type octet_difference_type;
        const octet_difference_type length = utf8::internal::sequence_length(it);

        // Get trail octets and calculate the code point
        utf_error err = UTF8_OK;
        switch (length) {
            case 0: 
                return INVALID_LEAD;
            case 1:
                err = utf8::internal::get_sequence_1(it, end, cp);
                break;
            case 2:
                err = utf8::internal::get_sequence_2(it, end, cp);
            break;
            case 3:
                err = utf8::internal::get_sequence_3(it, end, cp);
            break;
            case 4:
                err = utf8::internal::get_sequence_4(it, end, cp);
            break;
        }

        if (err == UTF8_OK) {
            // Decoding succeeded. Now, security checks...
            if (utf8::internal::is_code_point_valid(cp)) {
                if (!utf8::internal::is_overlong_sequence(cp, length)){
                    // Passed! Return here.
                    code_point = cp;
                    ++it;
                    return UTF8_OK;
                }
                else
                    err = OVERLONG_SEQUENCE;
            }
            else 
                err = INVALID_CODE_POINT;
        }

        // Failure branch - restore the original value of the iterator
        it = original_it;
        return err;
    }